

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-ssl.c
# Opt level: O3

int lws_openssl_describe_cipher(lws *wsi)

{
  SSL *s;
  SSL_CIPHER *pSVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  int np;
  
  np = -1;
  s = (SSL *)(wsi->tls).ssl;
  pSVar1 = SSL_get_current_cipher(s);
  SSL_CIPHER_get_bits(pSVar1,&np);
  pSVar1 = SSL_get_current_cipher(s);
  pcVar2 = SSL_CIPHER_get_name(pSVar1);
  pSVar1 = SSL_get_current_cipher(s);
  pcVar3 = SSL_CIPHER_get_name(pSVar1);
  uVar5 = (ulong)(uint)np;
  pSVar1 = SSL_get_current_cipher(s);
  pcVar4 = SSL_CIPHER_get_version(pSVar1);
  _lws_log(8,"%s: wsi %p: %s, %s, %d bits, %s\n","lws_openssl_describe_cipher",wsi,pcVar2,pcVar3,
           uVar5,pcVar4);
  return 0;
}

Assistant:

int lws_openssl_describe_cipher(struct lws *wsi)
{
#if !defined(LWS_WITH_NO_LOGS)
	int np = -1;
	SSL *s = wsi->tls.ssl;

	SSL_get_cipher_bits(s, &np);
	lwsl_info("%s: wsi %p: %s, %s, %d bits, %s\n", __func__, wsi,
			SSL_get_cipher_name(s), SSL_get_cipher(s), np,
			SSL_get_cipher_version(s));
#endif

	return 0;
}